

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToEquivClass
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  undefined4 *puVar3;
  bool bVar4;
  uint uVar5;
  uint h;
  uint index;
  int j;
  long lVar6;
  char16 local_4c [4];
  Char equivs [4];
  uint acth;
  uint local_34 [2];
  uint tblidx;
  
  local_34[0] = 0;
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    index = 0;
    register0x00000000 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      puVar3 = stack0xffffffffffffffc0;
      if (4 < (this->rep).compact.countPlusOne - 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x1ef,"(IsCompact())","IsCompact()");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar3 = 0;
      }
      if (*(int *)&this->rep - 1U <= index) break;
      uVar5 = GetCompactCharU(this,index);
      h = GetCompactCharU(this,index);
      bVar4 = CaseInsensitive::RangeToEquivClass(local_34,uVar5,h,(uint *)equivs,local_4c);
      if (bVar4) {
        lVar6 = 0;
        do {
          SetRange(result,allocator,local_4c[lVar6],local_4c[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
      }
      else {
        uVar5 = GetCompactCharU(this,index);
        SetRange(result,allocator,(Char)uVar5,(Char)uVar5);
      }
      index = index + 1;
    }
  }
  else {
    CharBitvec::ToEquivClass<char16_t>(&(this->rep).full.direct,allocator,0,local_34,result,0);
    pCVar1 = (this->rep).full.root;
    if (pCVar1 != (CharSetNode *)0x0) {
      (*pCVar1->_vptr_CharSetNode[7])(pCVar1,allocator,2,0,local_34,result);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::ToEquivClass(ArenaAllocator* allocator, CharSet<Char>& result)
    {
        uint tblidx = 0;
        if (IsCompact())
        {
            Sort();
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                uint acth;
                Char equivs[CaseInsensitive::EquivClassSize];
                if (CaseInsensitive::RangeToEquivClass(tblidx, this->GetCompactCharU(i), this->GetCompactCharU(i), acth, equivs))
                {
                    for (int j = 0; j < CaseInsensitive::EquivClassSize; j++)
                    {
                        result.Set(allocator, equivs[j]);
                    }
                }
                else
                {
                    result.Set(allocator, this->GetCompactChar(i));
                }
            }
        }
        else
        {
            rep.full.direct.ToEquivClass<char16>(allocator, 0, tblidx, result);
            if (rep.full.root != nullptr)
            {
                rep.full.root->ToEquivClassW(allocator, CharSetNode::levels - 1, 0, tblidx, result);
            }
        }
    }